

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::TanH_x86_avx512::forward_inplace(TanH_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  float afVar4 [16];
  float afVar5 [16];
  float afVar6 [16];
  float afVar7 [16];
  float afVar8 [16];
  float afVar9 [16];
  float afVar10 [16];
  float afVar11 [16];
  float afVar12 [16];
  float afVar13 [16];
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  undefined1 (*pauVar19) [64];
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar46 [32];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar25 [16];
  undefined1 auVar45 [32];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    auVar47 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar48 = vxorps_avx512dq(auVar47,(undefined1  [64])_ps512_cephes_exp_C1);
    auVar47 = vxorps_avx512dq(auVar47,(undefined1  [64])_ps512_cephes_exp_C2);
    auVar49 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
    lVar18 = 0;
    auVar50 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
    auVar51 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar29 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
    auVar31 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar32 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
    do {
      afVar13 = _ps512_cephes_exp_p5;
      afVar12 = _ps512_cephes_exp_p4;
      afVar11 = _ps512_cephes_exp_p3;
      afVar10 = _ps512_cephes_exp_p2;
      afVar9 = _ps512_cephes_exp_p1;
      afVar8 = _ps512_cephes_exp_p0;
      afVar7 = _ps512_cephes_LOG2EF;
      afVar6 = _ps512_exp_lo;
      afVar5 = _ps512_exp_hi;
      afVar4 = _ps512_1;
      pauVar19 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar17 < 0x10) {
        uVar15 = 0;
      }
      else {
        iVar14 = 0xf;
        do {
          auVar52 = vmulps_avx512f(auVar50,*pauVar19);
          auVar52 = vminps_avx512f(auVar52,(undefined1  [64])afVar5);
          auVar52 = vmaxps_avx512f(auVar52,(undefined1  [64])afVar6);
          auVar53 = vfmadd213ps_avx512f((undefined1  [64])afVar7,auVar52,(undefined1  [64])afVar13);
          auVar54 = vrndscaleps_avx512f(auVar53,1);
          uVar3 = vcmpps_avx512f(auVar53,auVar54,1);
          auVar53 = vsubps_avx512f(auVar54,(undefined1  [64])afVar4);
          bVar2 = (bool)((byte)uVar3 & 1);
          auVar55._0_4_ = (uint)bVar2 * auVar53._0_4_ | (uint)!bVar2 * auVar54._0_4_;
          bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
          auVar55._4_4_ = (uint)bVar2 * auVar53._4_4_ | (uint)!bVar2 * auVar54._4_4_;
          bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
          auVar55._8_4_ = (uint)bVar2 * auVar53._8_4_ | (uint)!bVar2 * auVar54._8_4_;
          bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
          auVar55._12_4_ = (uint)bVar2 * auVar53._12_4_ | (uint)!bVar2 * auVar54._12_4_;
          bVar2 = (bool)((byte)(uVar3 >> 4) & 1);
          auVar55._16_4_ = (uint)bVar2 * auVar53._16_4_ | (uint)!bVar2 * auVar54._16_4_;
          bVar2 = (bool)((byte)(uVar3 >> 5) & 1);
          auVar55._20_4_ = (uint)bVar2 * auVar53._20_4_ | (uint)!bVar2 * auVar54._20_4_;
          bVar2 = (bool)((byte)(uVar3 >> 6) & 1);
          auVar55._24_4_ = (uint)bVar2 * auVar53._24_4_ | (uint)!bVar2 * auVar54._24_4_;
          bVar2 = (bool)((byte)(uVar3 >> 7) & 1);
          auVar55._28_4_ = (uint)bVar2 * auVar53._28_4_ | (uint)!bVar2 * auVar54._28_4_;
          bVar2 = (bool)((byte)(uVar3 >> 8) & 1);
          auVar55._32_4_ = (uint)bVar2 * auVar53._32_4_ | (uint)!bVar2 * auVar54._32_4_;
          bVar2 = (bool)((byte)(uVar3 >> 9) & 1);
          auVar55._36_4_ = (uint)bVar2 * auVar53._36_4_ | (uint)!bVar2 * auVar54._36_4_;
          bVar2 = (bool)((byte)(uVar3 >> 10) & 1);
          auVar55._40_4_ = (uint)bVar2 * auVar53._40_4_ | (uint)!bVar2 * auVar54._40_4_;
          bVar2 = (bool)((byte)(uVar3 >> 0xb) & 1);
          auVar55._44_4_ = (uint)bVar2 * auVar53._44_4_ | (uint)!bVar2 * auVar54._44_4_;
          bVar2 = (bool)((byte)(uVar3 >> 0xc) & 1);
          auVar55._48_4_ = (uint)bVar2 * auVar53._48_4_ | (uint)!bVar2 * auVar54._48_4_;
          bVar2 = (bool)((byte)(uVar3 >> 0xd) & 1);
          auVar55._52_4_ = (uint)bVar2 * auVar53._52_4_ | (uint)!bVar2 * auVar54._52_4_;
          bVar2 = (bool)((byte)(uVar3 >> 0xe) & 1);
          auVar55._56_4_ = (uint)bVar2 * auVar53._56_4_ | (uint)!bVar2 * auVar54._56_4_;
          bVar2 = SUB81(uVar3 >> 0xf,0);
          auVar55._60_4_ = (uint)bVar2 * auVar53._60_4_ | (uint)!bVar2 * auVar54._60_4_;
          auVar52 = vfmadd231ps_avx512f(auVar52,auVar55,auVar48);
          auVar52 = vfmadd231ps_avx512f(auVar52,auVar55,auVar47);
          auVar53 = vmulps_avx512f(auVar52,auVar52);
          auVar54 = vfmadd213ps_avx512f(auVar52,(undefined1  [64])afVar8,(undefined1  [64])afVar9);
          auVar54 = vfmadd213ps_avx512f(auVar54,auVar52,(undefined1  [64])afVar10);
          auVar54 = vfmadd213ps_avx512f(auVar54,auVar52,(undefined1  [64])afVar11);
          auVar54 = vfmadd213ps_avx512f(auVar54,auVar52,(undefined1  [64])afVar12);
          auVar54 = vfmadd213ps_avx512f(auVar54,auVar52,(undefined1  [64])afVar13);
          auVar52 = vfmadd213ps_avx512f(auVar54,auVar53,auVar52);
          auVar52 = vaddps_avx512f(auVar52,(undefined1  [64])afVar4);
          auVar53 = vcvttps2dq_avx512f(auVar55);
          auVar53 = vpaddd_avx512f(auVar49,auVar53);
          auVar53 = vpslld_avx512f(auVar53,0x17);
          auVar52 = vfmadd213ps_avx512f(auVar53,auVar52,auVar51);
          auVar53 = vrcp14ps_avx512f(auVar52);
          auVar52 = vfmsub213ps_avx512f(auVar52,auVar53,auVar51);
          auVar52 = vfnmadd132ps_avx512vl(auVar52,auVar53,auVar53);
          auVar52 = vfnmsub213ps_avx512f(auVar52,auVar50,auVar51);
          *pauVar19 = auVar52;
          pauVar19 = pauVar19 + 1;
          iVar14 = iVar14 + 0x10;
          uVar15 = uVar17 & 0xfffffff0;
        } while (iVar14 < (int)uVar17);
      }
      uVar16 = uVar15 | 7;
      auVar60._8_4_ = 0x3f800000;
      auVar60._0_8_ = 0x3f8000003f800000;
      auVar60._12_4_ = 0x3f800000;
      auVar60._16_4_ = 0x3f800000;
      auVar60._20_4_ = 0x3f800000;
      auVar60._24_4_ = 0x3f800000;
      auVar60._28_4_ = 0x3f800000;
      auVar61._8_4_ = 0x42b0c0a5;
      auVar61._0_8_ = 0x42b0c0a542b0c0a5;
      auVar61._12_4_ = 0x42b0c0a5;
      auVar62._8_4_ = 0xc2b0c0a5;
      auVar62._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar62._12_4_ = 0xc2b0c0a5;
      auVar63._8_4_ = 0x3f000000;
      auVar63._0_8_ = 0x3f0000003f000000;
      auVar63._12_4_ = 0x3f000000;
      auVar65._8_4_ = 0x3f800000;
      auVar65._0_8_ = 0x3f8000003f800000;
      auVar65._12_4_ = 0x3f800000;
      auVar67._8_4_ = 0x395e8083;
      auVar67._0_8_ = 0x395e8083395e8083;
      auVar67._12_4_ = 0x395e8083;
      auVar68._8_4_ = 0x39506967;
      auVar68._0_8_ = 0x3950696739506967;
      auVar68._12_4_ = 0x39506967;
      auVar69._8_4_ = 0x3ab743ce;
      auVar69._0_8_ = 0x3ab743ce3ab743ce;
      auVar69._12_4_ = 0x3ab743ce;
      auVar70._8_4_ = 0x3c088908;
      auVar70._0_8_ = 0x3c0889083c088908;
      auVar70._12_4_ = 0x3c088908;
      auVar71._8_4_ = 0x3d2aa9c1;
      auVar71._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar71._12_4_ = 0x3d2aa9c1;
      auVar21 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar22 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      auVar23 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      while ((int)uVar16 < (int)uVar17) {
        auVar42 = vmulps_avx512vl(auVar29,*(undefined1 (*) [32])*pauVar19);
        auVar42 = vminps_avx512vl(auVar42,auVar30);
        auVar43 = vmaxps_avx512vl(auVar42,auVar31);
        auVar44 = vfmadd231ps_avx512vl(auVar32,auVar43,auVar33);
        auVar42 = vroundps_avx(auVar44,1);
        uVar3 = vcmpps_avx512vl(auVar44,auVar42,1);
        auVar45 = vsubps_avx512vl(auVar42,auVar34);
        bVar2 = (bool)((byte)uVar3 & 1);
        auVar46._0_4_ = (float)((uint)bVar2 * auVar45._0_4_ | (uint)!bVar2 * auVar42._0_4_);
        bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
        auVar46._4_4_ = (float)((uint)bVar2 * auVar45._4_4_ | (uint)!bVar2 * auVar42._4_4_);
        bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
        auVar46._8_4_ = (float)((uint)bVar2 * auVar45._8_4_ | (uint)!bVar2 * auVar42._8_4_);
        bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
        auVar46._12_4_ = (float)((uint)bVar2 * auVar45._12_4_ | (uint)!bVar2 * auVar42._12_4_);
        bVar2 = (bool)((byte)(uVar3 >> 4) & 1);
        auVar46._16_4_ = (float)((uint)bVar2 * auVar45._16_4_ | (uint)!bVar2 * auVar42._16_4_);
        bVar2 = (bool)((byte)(uVar3 >> 5) & 1);
        auVar46._20_4_ = (float)((uint)bVar2 * auVar45._20_4_ | (uint)!bVar2 * auVar42._20_4_);
        bVar2 = (bool)((byte)(uVar3 >> 6) & 1);
        auVar46._24_4_ = (float)((uint)bVar2 * auVar45._24_4_ | (uint)!bVar2 * auVar42._24_4_);
        bVar2 = SUB81(uVar3 >> 7,0);
        auVar46._28_4_ = (float)((uint)bVar2 * auVar45._28_4_ | (uint)!bVar2 * auVar42._28_4_);
        auVar42 = vfmsub231ps_avx512vl(auVar43,auVar46,auVar35);
        auVar43 = vfmsub231ps_avx512vl(auVar42,auVar46,auVar36);
        auVar42._4_4_ = auVar43._4_4_ * auVar43._4_4_;
        auVar42._0_4_ = auVar43._0_4_ * auVar43._0_4_;
        auVar42._8_4_ = auVar43._8_4_ * auVar43._8_4_;
        auVar42._12_4_ = auVar43._12_4_ * auVar43._12_4_;
        auVar42._16_4_ = auVar43._16_4_ * auVar43._16_4_;
        auVar42._20_4_ = auVar43._20_4_ * auVar43._20_4_;
        auVar42._24_4_ = auVar43._24_4_ * auVar43._24_4_;
        auVar42._28_4_ = auVar44._28_4_;
        auVar44 = vfmadd213ps_avx512vl(auVar37,auVar43,auVar38);
        auVar44 = vfmadd213ps_avx512vl(auVar44,auVar43,auVar39);
        auVar44 = vfmadd213ps_avx512vl(auVar44,auVar43,auVar40);
        auVar44 = vfmadd213ps_avx512vl(auVar44,auVar43,auVar41);
        auVar44 = vfmadd213ps_avx512vl(auVar44,auVar43,auVar32);
        auVar24 = vfmadd213ps_fma(auVar44,auVar42,auVar43);
        auVar43 = vaddps_avx512vl(ZEXT1632(auVar24),auVar34);
        auVar44._0_4_ = (int)auVar46._0_4_;
        auVar44._4_4_ = (int)auVar46._4_4_;
        auVar44._8_4_ = (int)auVar46._8_4_;
        auVar44._12_4_ = (int)auVar46._12_4_;
        auVar44._16_4_ = (int)auVar46._16_4_;
        auVar44._20_4_ = (int)auVar46._20_4_;
        auVar44._24_4_ = (int)auVar46._24_4_;
        auVar44._28_4_ = (int)auVar46._28_4_;
        auVar42 = vpslld_avx2(auVar44,0x17);
        auVar42 = vpaddd_avx2(auVar42,auVar60);
        auVar43 = vfmadd213ps_avx512vl(auVar42,auVar43,auVar34);
        auVar42 = vrcpps_avx(auVar43);
        auVar43 = vfmsub213ps_avx512vl(auVar43,auVar42,auVar34);
        auVar24 = vfnmadd132ps_fma(auVar43,auVar42,auVar42);
        auVar42 = vfnmsub213ps_avx512vl(ZEXT1632(auVar24),auVar29,auVar34);
        *(undefined1 (*) [32])*pauVar19 = auVar42;
        pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x20);
        uVar16 = uVar15 + 0xf;
        uVar15 = uVar15 + 8;
      }
      uVar16 = uVar15 | 3;
      auVar64._8_4_ = 0x3fb8aa3b;
      auVar64._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar64._12_4_ = 0x3fb8aa3b;
      auVar66._8_4_ = 0x3f318000;
      auVar66._0_8_ = 0x3f3180003f318000;
      auVar66._12_4_ = 0x3f318000;
      auVar24 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      while ((int)uVar16 < (int)uVar17) {
        auVar27._0_4_ = *(float *)*pauVar19 * -2.0;
        auVar27._4_4_ = *(float *)(*pauVar19 + 4) * -2.0;
        auVar27._8_4_ = *(float *)(*pauVar19 + 8) * -2.0;
        auVar27._12_4_ = *(float *)(*pauVar19 + 0xc) * -2.0;
        auVar27 = vminps_avx(auVar27,auVar61);
        auVar28 = vmaxps_avx(auVar27,auVar62);
        auVar25 = vfmadd231ps_fma(auVar63,auVar28,auVar64);
        auVar58._0_4_ = (int)auVar25._0_4_;
        auVar58._4_4_ = (int)auVar25._4_4_;
        auVar58._8_4_ = (int)auVar25._8_4_;
        auVar58._12_4_ = (int)auVar25._12_4_;
        auVar27 = vcvtdq2ps_avx(auVar58);
        uVar3 = vcmpps_avx512vl(auVar25,auVar27,1);
        auVar25 = vsubps_avx512vl(auVar27,auVar65);
        bVar2 = (bool)((byte)uVar3 & 1);
        auVar26._0_4_ = (float)((uint)bVar2 * auVar25._0_4_ | (uint)!bVar2 * auVar27._0_4_);
        bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
        auVar26._4_4_ = (float)((uint)bVar2 * auVar25._4_4_ | (uint)!bVar2 * auVar27._4_4_);
        bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
        auVar26._8_4_ = (float)((uint)bVar2 * auVar25._8_4_ | (uint)!bVar2 * auVar27._8_4_);
        bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
        auVar26._12_4_ = (float)((uint)bVar2 * auVar25._12_4_ | (uint)!bVar2 * auVar27._12_4_);
        auVar27 = vfmsub231ps_fma(auVar28,auVar26,auVar66);
        auVar28 = vfmsub231ps_fma(auVar27,auVar26,auVar67);
        auVar25._0_4_ = auVar28._0_4_ * auVar28._0_4_;
        auVar25._4_4_ = auVar28._4_4_ * auVar28._4_4_;
        auVar25._8_4_ = auVar28._8_4_ * auVar28._8_4_;
        auVar25._12_4_ = auVar28._12_4_ * auVar28._12_4_;
        auVar27 = vfmadd213ps_fma(auVar68,auVar28,auVar69);
        auVar27 = vfmadd213ps_fma(auVar27,auVar28,auVar70);
        auVar27 = vfmadd213ps_fma(auVar27,auVar28,auVar71);
        auVar27 = vfmadd213ps_avx512vl(auVar27,auVar28,auVar21);
        auVar27 = vfmadd213ps_fma(auVar27,auVar28,auVar63);
        auVar27 = vfmadd213ps_fma(auVar27,auVar25,auVar28);
        auVar28._0_4_ = auVar27._0_4_ + 1.0;
        auVar28._4_4_ = auVar27._4_4_ + 1.0;
        auVar28._8_4_ = auVar27._8_4_ + 1.0;
        auVar28._12_4_ = auVar27._12_4_ + 1.0;
        auVar57._0_4_ = (int)auVar26._0_4_;
        auVar57._4_4_ = (int)auVar26._4_4_;
        auVar57._8_4_ = (int)auVar26._8_4_;
        auVar57._12_4_ = (int)auVar26._12_4_;
        auVar27 = vpslld_avx(auVar57,0x17);
        auVar27 = vpaddd_avx512vl(auVar27,auVar22);
        auVar28 = vfmadd213ps_fma(auVar27,auVar28,auVar65);
        auVar27 = vrcpps_avx(auVar28);
        auVar59._0_4_ = auVar27._0_4_ + auVar27._0_4_;
        auVar59._4_4_ = auVar27._4_4_ + auVar27._4_4_;
        auVar59._8_4_ = auVar27._8_4_ + auVar27._8_4_;
        auVar59._12_4_ = auVar27._12_4_ + auVar27._12_4_;
        auVar28 = vfmsub213ps_avx512vl(auVar28,auVar59,auVar23);
        auVar27 = vfnmadd213ps_fma(auVar28,auVar27,auVar59);
        auVar27 = vaddps_avx512vl(auVar27,auVar24);
        *(undefined1 (*) [16])*pauVar19 = auVar27;
        pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x10);
        uVar16 = uVar15 + 7;
        uVar15 = uVar15 + 4;
      }
      if (uVar17 - uVar15 != 0 && (int)uVar15 <= (int)uVar17) {
        lVar20 = 0;
        do {
          fVar56 = tanhf(*(float *)(*pauVar19 + lVar20 * 4));
          *(float *)(*pauVar19 + lVar20 * 4) = fVar56;
          lVar20 = lVar20 + 1;
        } while (uVar17 - uVar15 != (int)lVar20);
      }
      lVar18 = lVar18 + 1;
      auVar49 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar50 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      auVar51 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar29 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar31 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar32 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
    } while (lVar18 != iVar1);
  }
  return 0;
}

Assistant:

int TanH_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanhf(*ptr);
            ptr++;
        }
    }

    return 0;
}